

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::OptionValue::parse_default
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details)

{
  __shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &details->super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ensure_value(this,(shared_ptr<const_cxxopts::OptionDetails> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (*((this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Value[4])();
  return;
}

Assistant:

void
        parse_default(std::shared_ptr<const OptionDetails> details)
        {
            ensure_value(details);
            m_value->parse();
        }